

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O1

int __thiscall cmCTestUpdateHandler::DetectVCS(cmCTestUpdateHandler *this,char *dir)

{
  cmCTest *this_00;
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  string sourceDirectory;
  ostringstream cmCTestLog_msg;
  long *local_1d8;
  char *local_1d0;
  long local_1c8 [2];
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  std::__cxx11::string::string((string *)&local_1d8,dir,(allocator *)local_198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Check directory: ",0x11);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_1d8,(long)local_1d0);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,0,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x101,(char *)local_1b8,(this->super_cmCTestGenericHandler).Quiet);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  std::__cxx11::string::append((char *)&local_1d8);
  bVar2 = cmsys::SystemTools::FileExists((char *)local_1d8);
  pcVar1 = local_1d0;
  iVar4 = 2;
  if (!bVar2) {
    strlen(dir);
    std::__cxx11::string::_M_replace((ulong)&local_1d8,0,pcVar1,(ulong)dir);
    std::__cxx11::string::append((char *)&local_1d8);
    bVar2 = cmsys::SystemTools::FileExists((char *)local_1d8);
    pcVar1 = local_1d0;
    iVar4 = 1;
    if (!bVar2) {
      strlen(dir);
      std::__cxx11::string::_M_replace((ulong)&local_1d8,0,pcVar1,(ulong)dir);
      std::__cxx11::string::append((char *)&local_1d8);
      bVar2 = cmsys::SystemTools::FileExists((char *)local_1d8);
      pcVar1 = local_1d0;
      iVar4 = 3;
      if (!bVar2) {
        strlen(dir);
        std::__cxx11::string::_M_replace((ulong)&local_1d8,0,pcVar1,(ulong)dir);
        std::__cxx11::string::append((char *)&local_1d8);
        bVar2 = cmsys::SystemTools::FileExists((char *)local_1d8);
        pcVar1 = local_1d0;
        iVar4 = 4;
        if (!bVar2) {
          strlen(dir);
          std::__cxx11::string::_M_replace((ulong)&local_1d8,0,pcVar1,(ulong)dir);
          std::__cxx11::string::append((char *)&local_1d8);
          bVar2 = cmsys::SystemTools::FileExists((char *)local_1d8);
          iVar4 = 5;
          if (!bVar2) {
            strlen(dir);
            std::__cxx11::string::_M_replace((ulong)&local_1d8,0,local_1d0,(ulong)dir);
            std::__cxx11::string::append((char *)&local_1d8);
            bVar2 = cmsys::SystemTools::FileExists((char *)local_1d8);
            iVar4 = 6;
            if (!bVar2) {
              std::__cxx11::string::operator=((string *)&local_1d8,dir);
              std::__cxx11::string::append((char *)&local_1d8);
              bVar2 = cmsys::SystemTools::FileExists((char *)local_1d8);
              iVar4 = 6;
              if (!bVar2) {
                iVar4 = 0;
              }
            }
          }
        }
      }
    }
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  return iVar4;
}

Assistant:

int cmCTestUpdateHandler::DetectVCS(const char* dir)
{
  std::string sourceDirectory = dir;
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Check directory: " << sourceDirectory << std::endl,
                     this->Quiet);
  sourceDirectory += "/.svn";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_SVN;
  }
  sourceDirectory = dir;
  sourceDirectory += "/CVS";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_CVS;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.bzr";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_BZR;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.git";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_GIT;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.hg";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_HG;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.p4";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_P4;
  }
  sourceDirectory = dir;
  sourceDirectory += "/.p4config";
  if (cmSystemTools::FileExists(sourceDirectory.c_str())) {
    return cmCTestUpdateHandler::e_P4;
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}